

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

iterator __thiscall
QList<std::pair<QString,_QFileInfo>_>::erase
          (QList<std::pair<QString,_QFileInfo>_> *this,const_iterator abegin,const_iterator aend)

{
  Data *pDVar1;
  iterator iVar2;
  long lVar3;
  
  lVar3 = (long)abegin.i - (long)(this->d).ptr;
  if ((long)aend.i - (long)abegin.i != 0) {
    pDVar1 = (this->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::reallocateAndGrow
                (&this->d,GrowsAtEnd,0,(QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0);
    }
    QtPrivate::QMovableArrayOps<std::pair<QString,_QFileInfo>_>::erase
              ((QMovableArrayOps<std::pair<QString,_QFileInfo>_> *)this,
               (pair<QString,_QFileInfo> *)((long)(this->d).ptr + lVar3),
               (long)aend.i - (long)abegin.i >> 5);
  }
  iVar2 = begin(this);
  return (iterator)(iVar2.i + lVar3);
}

Assistant:

typename QList<T>::iterator QList<T>::erase(const_iterator abegin, const_iterator aend)
{
    Q_ASSERT_X(isValidIterator(abegin), "QList::erase", "The specified iterator argument 'abegin' is invalid");
    Q_ASSERT_X(isValidIterator(aend), "QList::erase", "The specified iterator argument 'aend' is invalid");
    Q_ASSERT(aend >= abegin);

    qsizetype i = std::distance(constBegin(), abegin);
    qsizetype n = std::distance(abegin, aend);
    remove(i, n);

    return begin() + i;
}